

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

vector<cfd::js::api::ElementsDestroyAmountStruct,_std::allocator<cfd::js::api::ElementsDestroyAmountStruct>_>
* __thiscall
cfd::core::
JsonObjectVector<cfd::js::api::json::ElementsDestroyAmount,_cfd::js::api::ElementsDestroyAmountStruct>
::ConvertToStruct(vector<cfd::js::api::ElementsDestroyAmountStruct,_std::allocator<cfd::js::api::ElementsDestroyAmountStruct>_>
                  *__return_storage_ptr__,
                 JsonObjectVector<cfd::js::api::json::ElementsDestroyAmount,_cfd::js::api::ElementsDestroyAmountStruct>
                 *this)

{
  pointer pEVar1;
  pointer this_00;
  ElementsDestroyAmountStruct data;
  ElementsDestroyAmountStruct EStack_98;
  
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::ElementsDestroyAmountStruct,_std::allocator<cfd::js::api::ElementsDestroyAmountStruct>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::ElementsDestroyAmountStruct,_std::allocator<cfd::js::api::ElementsDestroyAmountStruct>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::ElementsDestroyAmountStruct,_std::allocator<cfd::js::api::ElementsDestroyAmountStruct>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pEVar1 = (this->super_JsonVector<cfd::js::api::json::ElementsDestroyAmount>).
           super_vector<cfd::js::api::json::ElementsDestroyAmount,_std::allocator<cfd::js::api::json::ElementsDestroyAmount>_>
           .
           super__Vector_base<cfd::js::api::json::ElementsDestroyAmount,_std::allocator<cfd::js::api::json::ElementsDestroyAmount>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->super_JsonVector<cfd::js::api::json::ElementsDestroyAmount>).
                 super_vector<cfd::js::api::json::ElementsDestroyAmount,_std::allocator<cfd::js::api::json::ElementsDestroyAmount>_>
                 .
                 super__Vector_base<cfd::js::api::json::ElementsDestroyAmount,_std::allocator<cfd::js::api::json::ElementsDestroyAmount>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pEVar1; this_00 = this_00 + 1
      ) {
    js::api::json::ElementsDestroyAmount::ConvertToStruct(&EStack_98,this_00);
    std::
    vector<cfd::js::api::ElementsDestroyAmountStruct,_std::allocator<cfd::js::api::ElementsDestroyAmountStruct>_>
    ::push_back(__return_storage_ptr__,&EStack_98);
    js::api::ElementsDestroyAmountStruct::~ElementsDestroyAmountStruct(&EStack_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }